

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterDropShadow.cpp
# Opt level: O1

SharedPtr<Filter> __thiscall
Rml::FilterDropShadowInstancer::InstanceFilter
          (FilterDropShadowInstancer *this,String *param_1,PropertyDictionary *properties)

{
  FilterDropShadow *pFVar1;
  Colour<unsigned_char,_255,_false> CVar2;
  Colour<unsigned_char,_255,_false> CVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  Property *this_00;
  Property *this_01;
  Property *this_02;
  Property *this_03;
  NumericValue NVar5;
  NumericValue NVar6;
  NumericValue NVar7;
  PropertyDictionary *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  SharedPtr<Filter> SVar9;
  SharedPtr<Rml::FilterDropShadow> decorator;
  Colour<unsigned_char,_255,_false> local_4c;
  FilterDropShadow *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  FilterDropShadowInstancer *local_38;
  
  this_00 = PropertyDictionary::GetProperty(in_RCX,param_1[3].field_2._M_local_buf[8]);
  this_01 = PropertyDictionary::GetProperty(in_RCX,param_1[3].field_2._M_local_buf[9]);
  this_02 = PropertyDictionary::GetProperty(in_RCX,param_1[3].field_2._M_local_buf[10]);
  this_03 = PropertyDictionary::GetProperty(in_RCX,param_1[3].field_2._M_local_buf[0xb]);
  if ((this_02 == (Property *)0x0 || (this_01 == (Property *)0x0 || this_00 == (Property *)0x0)) ||
      this_03 == (Property *)0x0) {
    (this->super_FilterInstancer)._vptr_FilterInstancer = (_func_int **)0x0;
    (this->super_FilterInstancer).super_EffectSpecification.properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _Var8._M_pi = extraout_RDX;
  }
  else {
    local_48 = (FilterDropShadow *)0x0;
    local_38 = this;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Rml::FilterDropShadow,std::allocator<Rml::FilterDropShadow>>
              (&local_40,&local_48,(allocator<Rml::FilterDropShadow> *)&local_4c);
    pFVar1 = local_48;
    local_4c.red = '\0';
    local_4c.green = '\0';
    local_4c.blue = '\0';
    local_4c.alpha = 0xff;
    Variant::GetInto<Rml::Colour<unsigned_char,_255,_false>,_0>(&this_00->value,&local_4c);
    CVar2 = local_4c;
    NVar5 = Property::GetNumericValue(this_01);
    NVar6 = Property::GetNumericValue(this_02);
    NVar7 = Property::GetNumericValue(this_03);
    this = local_38;
    _Var4._M_pi = local_40._M_pi;
    CVar3 = local_4c;
    _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)NVar6 >> 0x20);
    local_4c.red = CVar2.red;
    local_4c.green = CVar2.green;
    local_4c.blue = CVar2.blue;
    local_4c.alpha = CVar2.alpha;
    (pFVar1->color).red = local_4c.red;
    (pFVar1->color).green = local_4c.green;
    (pFVar1->color).blue = local_4c.blue;
    (pFVar1->color).alpha = local_4c.alpha;
    (pFVar1->value_offset_x).number = NVar5.number;
    (pFVar1->value_offset_x).unit = NVar5.unit;
    (pFVar1->value_offset_y).number = NVar6.number;
    (pFVar1->value_offset_y).unit = NVar6.unit;
    (pFVar1->value_sigma).number = NVar7.number;
    (pFVar1->value_sigma).unit = NVar7.unit;
    if (((((ulong)NVar5 >> 0x20 & 0x3fbc0) == 0) ||
        (_Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)(NVar6.unit & LENGTH),
        ((ulong)NVar6 & 0x3fbc000000000) == 0)) || (((ulong)NVar7 & 0x3fbc000000000) == 0)) {
      (local_38->super_FilterInstancer)._vptr_FilterInstancer = (_func_int **)0x0;
      (local_38->super_FilterInstancer).super_EffectSpecification.properties.properties.
      super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
    else {
      (local_38->super_FilterInstancer)._vptr_FilterInstancer = (_func_int **)local_48;
      (local_38->super_FilterInstancer).super_EffectSpecification.properties.properties.
      super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (local_38->super_FilterInstancer).super_EffectSpecification.properties.properties.
      super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var4._M_pi;
      local_48 = (FilterDropShadow *)0x0;
    }
    if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_4c = CVar3;
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
      _Var8._M_pi = extraout_RDX_00;
    }
  }
  SVar9.super___shared_ptr<Rml::Filter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var8._M_pi;
  SVar9.super___shared_ptr<Rml::Filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SharedPtr<Filter>)SVar9.super___shared_ptr<Rml::Filter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Filter> FilterDropShadowInstancer::InstanceFilter(const String& /*name*/, const PropertyDictionary& properties)
{
	const Property* p_color = properties.GetProperty(ids.color);
	const Property* p_offset_x = properties.GetProperty(ids.offset_x);
	const Property* p_offset_y = properties.GetProperty(ids.offset_y);
	const Property* p_sigma = properties.GetProperty(ids.sigma);
	if (!p_color || !p_offset_x || !p_offset_y || !p_sigma)
		return nullptr;

	auto decorator = MakeShared<FilterDropShadow>();
	if (decorator->Initialise(p_color->Get<Colourb>(), p_offset_x->GetNumericValue(), p_offset_y->GetNumericValue(), p_sigma->GetNumericValue()))
		return decorator;

	return nullptr;
}